

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license_verifier.cpp
# Opt level: O0

FUNCTION_RETURN __thiscall
license::LicenseVerifier::verify_limits(LicenseVerifier *this,FullLicenseInfo *lic_info)

{
  EventRegistry *pEVar1;
  bool bVar2;
  LCC_EVENT_TYPE event_00;
  FUNCTION_RETURN FVar3;
  char *pcVar4;
  time_t tVar5;
  char *pcVar6;
  pointer ppVar7;
  bool local_1c1;
  bool local_189;
  bool local_151;
  const_iterator cStack_120;
  LCC_EVENT_TYPE event;
  allocator local_111;
  key_type local_110;
  _Self local_f0;
  const_iterator client_sig;
  _Self local_c8;
  allocator local_b9;
  key_type local_b8;
  _Self local_98;
  const_iterator start_date;
  _Self local_70 [3];
  allocator local_51;
  key_type local_50;
  _Self local_30;
  const_iterator expiry;
  time_t now;
  bool is_valid;
  FullLicenseInfo *lic_info_local;
  LicenseVerifier *this_local;
  
  now._7_1_ = lic_info->m_magic == 0;
  if (!now._7_1_) {
    pEVar1 = this->m_event_registry;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    EventRegistry::addEvent(pEVar1,IFF_LOOPBACK,pcVar4,(char *)0x0);
  }
  expiry._M_node = (_Base_ptr)time((time_t *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"valid-to",&local_51);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&lic_info->m_limits,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_151 = false;
  if (now._7_1_) {
    local_70[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&lic_info->m_limits);
    local_151 = std::operator!=(&local_30,local_70);
  }
  if (local_151 != false) {
    ppVar7 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_30);
    tVar5 = seconds_from_epoch(&ppVar7->second);
    bVar2 = tVar5 < (long)expiry._M_node;
    if (bVar2) {
      pEVar1 = this->m_event_registry;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      ppVar7 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_30);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &start_date,"Expired ",&ppVar7->second);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      EventRegistry::addEvent(pEVar1,PRODUCT_EXPIRED,pcVar4,pcVar6);
      std::__cxx11::string::~string((string *)&start_date);
    }
    now._7_1_ = !bVar2 && now._7_1_;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"valid-from",&local_b9);
  local_98._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&lic_info->m_limits,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  local_189 = false;
  if (now._7_1_) {
    local_c8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&lic_info->m_limits);
    local_189 = std::operator!=(&local_98,&local_c8);
  }
  if (local_189 != false) {
    ppVar7 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_98);
    tVar5 = seconds_from_epoch(&ppVar7->second);
    if ((long)expiry._M_node < tVar5) {
      pEVar1 = this->m_event_registry;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      ppVar7 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_98);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &client_sig,"Valid from ",&ppVar7->second);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      EventRegistry::addEvent(pEVar1,PRODUCT_EXPIRED,pcVar4,pcVar6);
      std::__cxx11::string::~string((string *)&client_sig);
      now._7_1_ = false;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"client-signature",&local_111);
  local_f0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&lic_info->m_limits,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  local_1c1 = false;
  if (now._7_1_) {
    cStack_120 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end(&lic_info->m_limits);
    local_1c1 = std::operator!=(&local_f0,&stack0xfffffffffffffee0);
  }
  if (local_1c1 != false) {
    ppVar7 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_f0);
    event_00 = hw_identifier::HwIdentifierFacade::validate_pc_signature(&ppVar7->second);
    EventRegistry::addEvent(this->m_event_registry,event_00,&lic_info->source);
    now._7_1_ = now._7_1_ && event_00 == LICENSE_OK;
  }
  FVar3 = FUNC_RET_ERROR;
  if (now._7_1_) {
    FVar3 = FUNC_RET_OK;
  }
  return FVar3;
}

Assistant:

FUNCTION_RETURN LicenseVerifier::verify_limits(const FullLicenseInfo& lic_info) {
	bool is_valid = LCC_VERIFY_MAGIC;
	if (!is_valid) {
		m_event_registry.addEvent(LICENSE_CORRUPTED, lic_info.source.c_str());
	}
	const time_t now = time(nullptr);
	auto expiry = lic_info.m_limits.find(PARAM_EXPIRY_DATE);
	if (is_valid && expiry != lic_info.m_limits.end()) {
		if (seconds_from_epoch(expiry->second) < now) {
			m_event_registry.addEvent(PRODUCT_EXPIRED, lic_info.source.c_str(), ("Expired " + expiry->second).c_str());
			is_valid = false;
		}
	}
	const auto start_date = lic_info.m_limits.find(PARAM_BEGIN_DATE);
	if (is_valid && start_date != lic_info.m_limits.end()) {
		if (seconds_from_epoch(start_date->second) > now) {
			m_event_registry.addEvent(PRODUCT_EXPIRED, lic_info.source.c_str(),
									  ("Valid from " + start_date->second).c_str());
			is_valid = false;
		}
	}
	const auto client_sig = lic_info.m_limits.find(PARAM_CLIENT_SIGNATURE);
	if (is_valid && client_sig != lic_info.m_limits.end()) {
		const LCC_EVENT_TYPE event = hw_identifier::HwIdentifierFacade::validate_pc_signature(client_sig->second);
		m_event_registry.addEvent(event, lic_info.source);
		is_valid = is_valid && (event == LICENSE_OK);
	}
	return is_valid ? FUNC_RET_OK : FUNC_RET_ERROR;
}